

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::FilenameToClassname
                   (string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  ulong uVar2;
  
  std::__cxx11::string::find_last_of((char *)filename,0x360593,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  if (__return_storage_ptr__->_M_string_length != 0) {
    uVar2 = 0;
    do {
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if (pcVar1[uVar2] == '/') {
        pcVar1[uVar2] = '\\';
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < __return_storage_ptr__->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FilenameToClassname(const string& filename) {
  int lastindex = filename.find_last_of(".");
  std::string result = filename.substr(0, lastindex);
  for (int i = 0; i < result.size(); i++) {
    if (result[i] == '/') {
      result[i] = '\\';
    }
  }
  return result;
}